

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int ptls_export_secret(ptls_t *tls,void *output,size_t outlen,char *label,ptls_iovec_t context_value
                      ,int is_early)

{
  ptls_iovec_t secret;
  ptls_iovec_t secret_00;
  ptls_iovec_t hash_value;
  ptls_iovec_t hash_value_00;
  uint8_t *in_RCX;
  size_t in_RDX;
  uint8_t *in_RDI;
  size_t in_R8;
  char *in_R9;
  int in_stack_00000008;
  int ret;
  uint8_t context_value_hash [64];
  uint8_t derived_secret [64];
  uint8_t *master_secret;
  ptls_hash_algorithm_t *algo;
  size_t in_stack_fffffffffffffea0;
  void *in_stack_fffffffffffffea8;
  void *in_stack_fffffffffffffeb0;
  ptls_hash_algorithm_t *in_stack_fffffffffffffeb8;
  void *local_118;
  int local_cc;
  undefined1 local_c8 [64];
  undefined1 local_88 [48];
  char *in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  ptls_hash_algorithm_t *algo_00;
  int local_4;
  
  algo_00 = *(ptls_hash_algorithm_t **)(*(long *)(in_RDI + 0x50) + 0x58);
  if (in_stack_00000008 == 0) {
    local_118 = *(void **)(in_RDI + 0x158);
  }
  else {
    local_118 = *(void **)(in_RDI + 0x150);
  }
  if (local_118 == (void *)0x0) {
    if (in_stack_00000008 == 0) {
      local_cc = 0x202;
    }
    else if ((*(uint *)(in_RDI + 8) & 0xfffffff7) == 0) {
      local_cc = 0x202;
    }
    else {
      local_cc = 0x207;
    }
    local_4 = local_cc;
  }
  else {
    local_4 = ptls_calc_hash(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                             in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
    if (local_4 == 0) {
      ptls_iovec_init(local_118,algo_00->digest_size);
      ptls_iovec_init(algo_00->empty_digest,algo_00->digest_size);
      secret.len = in_RDX;
      secret.base = in_RCX;
      hash_value.len = in_R8;
      hash_value.base = in_RDI;
      local_cc = hkdf_expand_label(algo_00,local_118,in_stack_ffffffffffffffb0,secret,
                                   in_stack_ffffffffffffffa8,hash_value,in_R9);
      if (local_cc == 0) {
        ptls_iovec_init(local_88,algo_00->digest_size);
        ptls_iovec_init(local_c8,algo_00->digest_size);
        secret_00.len = in_RDX;
        secret_00.base = in_RCX;
        hash_value_00.len = in_R8;
        hash_value_00.base = in_RDI;
        local_cc = hkdf_expand_label(algo_00,local_118,in_stack_ffffffffffffffb0,secret_00,
                                     in_stack_ffffffffffffffa8,hash_value_00,in_R9);
      }
      (*ptls_clear_memory)(local_88,0x40);
      (*ptls_clear_memory)(local_c8,0x40);
      local_4 = local_cc;
    }
  }
  return local_4;
}

Assistant:

int ptls_export_secret(ptls_t *tls, void *output, size_t outlen, const char *label, ptls_iovec_t context_value, int is_early)
{
    ptls_hash_algorithm_t *algo = tls->key_schedule->hashes[0].algo;
    uint8_t *master_secret = is_early ? tls->exporter_master_secret.early : tls->exporter_master_secret.one_rtt,
            derived_secret[PTLS_MAX_DIGEST_SIZE], context_value_hash[PTLS_MAX_DIGEST_SIZE];
    int ret;

    if (master_secret == NULL) {
        if (is_early) {
            switch (tls->state) {
            case PTLS_STATE_CLIENT_HANDSHAKE_START:
            case PTLS_STATE_SERVER_EXPECT_CLIENT_HELLO:
                ret = PTLS_ERROR_IN_PROGRESS;
                break;
            default:
                ret = PTLS_ERROR_NOT_AVAILABLE;
                break;
            }
        } else {
            ret = PTLS_ERROR_IN_PROGRESS;
        }
        return ret;
    }

    if ((ret = ptls_calc_hash(algo, context_value_hash, context_value.base, context_value.len)) != 0)
        return ret;

    if ((ret = hkdf_expand_label(algo, derived_secret, algo->digest_size, ptls_iovec_init(master_secret, algo->digest_size), label,
                                 ptls_iovec_init(algo->empty_digest, algo->digest_size), tls->key_schedule->hkdf_label_prefix)) !=
        0)
        goto Exit;
    ret = hkdf_expand_label(algo, output, outlen, ptls_iovec_init(derived_secret, algo->digest_size), "exporter",
                            ptls_iovec_init(context_value_hash, algo->digest_size), tls->key_schedule->hkdf_label_prefix);

Exit:
    ptls_clear_memory(derived_secret, sizeof(derived_secret));
    ptls_clear_memory(context_value_hash, sizeof(context_value_hash));
    return ret;
}